

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_compression_lzmaxz.c
# Opt level: O1

void verify_xz_lzma(char *buff,size_t used,uint16_t id,uint16_t flags)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  tm *ptVar7;
  archive *a;
  unsigned_long uVar8;
  la_ssize_t v2;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  char *pcVar9;
  ulong uVar10;
  char *p_;
  void *p__00;
  long lVar11;
  ulong v2_00;
  ulong v2_01;
  int *piVar12;
  int *_v1;
  void *pvVar13;
  char *pcVar14;
  void *p__01;
  archive_entry *ae;
  char filedata [27];
  tm_conflict tmbuf;
  archive_entry *local_90;
  undefined1 local_88 [11];
  undefined1 local_7d [21];
  tm local_68;
  
  ptVar7 = localtime_r(&now,&local_68);
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                   ,L'V',(uint)(a != (archive *)0x0),"(zip_archive = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar4 = archive_read_support_format_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_read_support_format_all(zip_archive)",a);
  iVar4 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_read_support_filter_all(zip_archive)",a);
  iVar4 = archive_read_open_memory(a,buff,used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Y',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_read_open_memory(zip_archive, buff, used)",a);
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'b',buff + (used - 0x16),"p","PK\x05\x06","\"PK\\005\\006\"",4,"4",
                      (void *)0x0);
  failure("This must be disk 0");
  uVar1 = i2le(buff + (used - 0x12));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'd',(ulong)uVar1,"i2le(p + 4)",0,"0",(void *)0x0);
  failure("Central dir must start on disk 0");
  uVar1 = i2le(buff + (used - 0x10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'f',(ulong)uVar1,"i2le(p + 6)",0,"0",(void *)0x0);
  failure("All central dir entries are on this disk");
  uVar1 = i2le(buff + (used - 0xe));
  uVar2 = i2le(buff + (used - 0xc));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'h',(ulong)uVar1,"i2le(p + 8)",(ulong)uVar2,"i2le(p + 10)",(void *)0x0);
  pcVar14 = buff + (used - 10);
  uVar5 = i4le(pcVar14);
  pcVar9 = buff + (used - 6);
  uVar6 = i4le(pcVar9);
  failure("CD start (%u) + CD length (%u) should == archive size - 22",(ulong)uVar5,(ulong)uVar6);
  uVar5 = i4le(pcVar14);
  uVar6 = i4le(pcVar9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'k',(ulong)(uVar5 + uVar6),"i4le(p + 12) + i4le(p + 16)",used - 0x16,
                      "used - 22",(void *)0x0);
  failure("no zip comment");
  uVar1 = i2le(buff + (used - 2));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'm',(ulong)uVar1,"i2le(p + 20)",0,"0",(void *)0x0);
  uVar5 = i4le(pcVar9);
  uVar10 = (ulong)uVar5;
  pcVar9 = buff + uVar10;
  uVar5 = i4le(pcVar14);
  failure("Central file record at offset %u should begin with PK\\001\\002 signature",(ulong)uVar5);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'v',pcVar9,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  uVar1 = i2le(pcVar9 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'w',(ulong)uVar1,"i2le(p + 4)",0x33f,"3 * 256 + 63",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'x',(ulong)uVar1,"i2le(p + 6)",0x3f,"63",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 8);
  v2_00 = CONCAT62(in_register_0000000a,flags) & 0xffffffff;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'y',(ulong)uVar1,"i2le(p + 8)",v2_00,"flags",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 10);
  v2_01 = CONCAT62(in_register_00000012,id) & 0xffffffff;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'z',(ulong)uVar1,"i2le(p + 10)",v2_01,"id",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'{',(ulong)uVar1,"i2le(p + 12)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0xe);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'|',(ulong)uVar1,"i2le(p + 14)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar8 = bitcrc32(0,".;:!?,\"\')(*",0xb);
  uVar8 = bitcrc32(uVar8,"-/>$\\#@+={][}&<%",0x10);
  uVar5 = i4le(buff + uVar10 + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x7f',(ulong)uVar5,"i4le(p + 16)",uVar8,"crc",(void *)0x0);
  uVar5 = i4le(buff + uVar10 + 0x18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x80',(ulong)uVar5,"i4le(p + 24)",0x1b,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0x1c);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x81',(ulong)uVar1,"i2le(p + 28)",4,"strlen(file_name)",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0x1e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x82',(ulong)uVar1,"i2le(p + 30)",0x18,"24",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x83',(ulong)uVar1,"i2le(p + 32)",0,"0",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x84',(ulong)uVar1,"i2le(p + 34)",0,"0",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0x24);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x85',(ulong)uVar1,"i2le(p + 36)",0,"0",(void *)0x0);
  uVar5 = i4le(buff + uVar10 + 0x26);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x86',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(p + 38) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar5 = i4le(buff + uVar10 + 0x2a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x87',(ulong)uVar5,"i4le(p + 42)",0,"0",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x88',buff + uVar10 + 0x2e,"p + 46","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0x32);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x8b',(ulong)uVar1,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0x34);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x8c',(ulong)uVar1,"i2le(p + 2)",0xb,"11",(void *)0x0);
  uVar1 = i2le(buff + uVar10 + 0x34);
  uVar10 = (ulong)uVar1;
  uVar1 = i2le(pcVar9 + uVar10 + 0x36);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x90',(ulong)uVar1,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  uVar1 = i2le(pcVar9 + uVar10 + 0x38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x91',(ulong)uVar1,"i2le(p + 2)",5,"5",(void *)0x0);
  pcVar14 = pcVar9 + uVar10 + 0x3a;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x92',(long)*pcVar14,"p[4]",1,"1",(void *)0x0);
  uVar5 = i4le(pcVar9 + uVar10 + 0x3b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x93',(ulong)uVar5,"i4le(p + 5)",now,"now",(void *)0x0);
  uVar1 = i2le(pcVar9 + uVar10 + 0x38);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x98',buff,"q","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  uVar2 = i2le(buff + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x99',(ulong)uVar2,"i2le(q + 4)",0x3f,"63",(void *)0x0);
  uVar2 = i2le(buff + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x9a',(ulong)uVar2,"i2le(q + 6)",v2_00,"flags",(void *)0x0);
  uVar2 = i2le(buff + 8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x9b',(ulong)uVar2,"i2le(q + 8)",v2_01,"id",(void *)0x0);
  uVar2 = i2le(buff + 10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x9c',(ulong)uVar2,"i2le(q + 10)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar2 = i2le(buff + 0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x9d',(ulong)uVar2,"i2le(q + 12)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar5 = i4le(buff + 0xe);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x9e',(ulong)uVar5,"i4le(q + 14)",0,"0",(void *)0x0);
  uVar5 = i4le(buff + 0x12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\x9f',(ulong)uVar5,"i4le(q + 18)",0,"0",(void *)0x0);
  uVar5 = i4le(buff + 0x16);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'\xa0',(ulong)uVar5,"i4le(q + 22)",0,"0",(void *)0x0);
  uVar2 = i2le(buff + 0x1a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¡',(ulong)uVar2,"i2le(q + 26)",4,"strlen(file_name)",(void *)0x0);
  pcVar9 = buff + 0x1c;
  uVar2 = i2le(pcVar9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¢',(ulong)uVar2,"i2le(q + 28)",0x29,"41",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'£',buff + 0x1e,"q + 30","file","file_name",4,"strlen(file_name)",
                      (void *)0x0);
  uVar2 = i2le(buff + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¦',(ulong)uVar2,"i2le(q)",0x7875,"0x7875",(void *)0x0);
  uVar2 = i2le(buff + 0x24);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'§',(ulong)uVar2,"i2le(q + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¨',(long)buff[0x26],"q[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'©',(long)buff[0x27],"q[5]",4,"4",(void *)0x0);
  uVar5 = i4le(buff + 0x28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ª',(ulong)uVar5,"i4le(q + 6)",10,"file_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'«',(long)buff[0x2c],"q[10]",4,"4",(void *)0x0);
  uVar5 = i4le(buff + 0x2d);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¬',(ulong)uVar5,"i4le(q + 11)",0x14,"file_gid",(void *)0x0);
  uVar2 = i2le(buff + 0x24);
  uVar10 = (ulong)uVar2;
  p_ = buff + uVar10 + 0x26;
  uVar2 = i2le(p_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¯',(ulong)uVar2,"i2le(q)",0x5455,"0x5455",(void *)0x0);
  uVar2 = i2le(buff + uVar10 + 0x28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'°',(ulong)uVar2,"i2le(q + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'±',(long)buff[uVar10 + 0x2a],"q[4]",3,"3",(void *)0x0);
  uVar5 = i4le(buff + uVar10 + 0x2b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'²',(ulong)uVar5,"i4le(q + 5)",now,"now",(void *)0x0);
  uVar5 = i4le(buff + uVar10 + 0x2f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'³',(ulong)uVar5,"i4le(q + 9)",now + 3,"now + 3",(void *)0x0);
  uVar2 = i2le(buff + uVar10 + 0x28);
  uVar10 = (ulong)uVar2;
  uVar2 = i2le(p_ + uVar10 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¶',(ulong)uVar2,"i2le(q)",0x6c78,"0x6c78",(void *)0x0);
  uVar2 = i2le(p_ + uVar10 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'·',(ulong)uVar2,"i2le(q + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¸',(long)p_[uVar10 + 8],"q[4]",7,"7",(void *)0x0);
  uVar2 = i2le(p_ + uVar10 + 9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'¹',(ulong)(uVar2 >> 8),"i2le(q + 5) >> 8",3,"3",(void *)0x0);
  uVar2 = i2le(p_ + uVar10 + 0xb);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'º',(ulong)uVar2,"i2le(q + 7)",0,"0",(void *)0x0);
  uVar5 = i4le(p_ + uVar10 + 0xd);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'»',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(q + 9) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar2 = i2le(p_ + uVar10 + 6);
  uVar3 = i2le(pcVar9);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                   ,L'¾',(uint)(p_ + uVar10 + 4 + (ulong)uVar2 + 4 == buff + (ulong)uVar3 + 0x22),
                   "q == extra_start + i2le(local_header + 28)",(void *)0x0);
  uVar2 = i2le(pcVar9);
  piVar12 = (int *)(buff + (ulong)uVar2 + 0x22);
  iVar4 = archive_read_next_header(a,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Â',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(zip_archive, &ae)"
                      ,a);
  pcVar9 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
             ,L'Ã',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  v2 = archive_read_data(a,local_88,0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ä',0x1b,"sizeof(filedata)",v2,
                      "archive_read_data(zip_archive, filedata, sizeof(filedata))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Å',local_88,"filedata",".;:!?,\"\')(*","file_data1",0xb,
                      "sizeof(file_data1)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ç',local_7d,"filedata + sizeof(file_data1)","-/>$\\#@+={][}&<%",
                      "file_data2",0x10,"sizeof(file_data2)",(void *)0x0);
  _v1 = piVar12;
  if (piVar12 < buff + (used - 3)) {
    lVar11 = (used - uVar2) + -0x25;
    do {
      _v1 = piVar12;
      if (*piVar12 == 0x8074b50) break;
      piVar12 = (int *)((long)piVar12 + 1);
      lVar11 = lVar11 + -1;
      _v1 = (int *)(buff + (used - 3));
    } while (lVar11 != 0);
  }
  uVar10 = (ulong)uVar1;
  pcVar9 = pcVar14 + uVar10;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ò',_v1,"q","PK\a\b","\"PK\\007\\010\"",4,"4",(void *)0x0);
  uVar5 = i4le(_v1 + 1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ó',(ulong)uVar5,"i4le(q + 4)",uVar8,"crc",(void *)0x0);
  uVar5 = i4le(_v1 + 3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ô',(ulong)uVar5,"i4le(q + 12)",0x1b,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ø',pcVar9,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  uVar1 = i2le(pcVar9 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ù',(ulong)uVar1,"i2le(p + 4)",0x314,"3 * 256 + 20",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ú',(ulong)uVar1,"i2le(p + 6)",0x14,"20",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Û',(ulong)uVar1,"i2le(p + 8)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ü',(ulong)uVar1,"i2le(p + 10)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ý',(ulong)uVar1,"i2le(p + 12)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0xe);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Þ',(ulong)uVar1,"i2le(p + 14)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar5 = i4le(pcVar14 + uVar10 + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'à',(ulong)uVar5,"i4le(p + 16)",0,"crc",(void *)0x0);
  uVar5 = i4le(pcVar14 + uVar10 + 0x14);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'á',(ulong)uVar5,"i4le(p + 20)",0,"0",(void *)0x0);
  uVar5 = i4le(pcVar14 + uVar10 + 0x18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'â',(ulong)uVar5,"i4le(p + 24)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0x1c);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ã',(ulong)uVar1,"i2le(p + 28)",7,"strlen(folder_name)",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0x1e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ä',(ulong)uVar1,"i2le(p + 30)",0x18,"24",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'å',(ulong)uVar1,"i2le(p + 32)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'æ',(ulong)uVar1,"i2le(p + 34)",0,"0",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0x24);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ç',(ulong)uVar1,"i2le(p + 36)",0,"0",(void *)0x0);
  uVar5 = i4le(pcVar14 + uVar10 + 0x26);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'è',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(p + 38) >> 16 & 01777",0x1ed,
                      "folder_perm",(void *)0x0);
  uVar5 = i4le(pcVar14 + uVar10 + 0x2a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'é',(ulong)uVar5,"i4le(p + 42)",(long)(_v1 + 4) - (long)buff,"q - buff",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ê',pcVar14 + uVar10 + 0x2e,"p + 46","folder/","folder_name",7,
                      "strlen(folder_name)",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0x35);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'í',(ulong)uVar1,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0x37);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'î',(ulong)uVar1,"i2le(p + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ï',(long)pcVar14[uVar10 + 0x39],"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ð',(long)pcVar14[uVar10 + 0x3a],"p[5]",4,"4",(void *)0x0);
  uVar5 = i4le(pcVar14 + uVar10 + 0x3b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ñ',(ulong)uVar5,"i4le(p + 6)",0x1e,"folder_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ò',(long)pcVar14[uVar10 + 0x3f],"p[10]",4,"4",(void *)0x0);
  uVar5 = i4le(pcVar14 + uVar10 + 0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ó',(ulong)uVar5,"i4le(p + 11)",0x28,"folder_gid",(void *)0x0);
  uVar1 = i2le(pcVar14 + uVar10 + 0x37);
  uVar10 = (ulong)uVar1;
  uVar1 = i2le(pcVar9 + uVar10 + 0x39);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ö',(ulong)uVar1,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  uVar1 = i2le(pcVar9 + uVar10 + 0x3b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'÷',(ulong)uVar1,"i2le(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ø',(long)pcVar9[uVar10 + 0x3d],"p[4]",1,"1",(void *)0x0);
  uVar5 = i4le(pcVar9 + uVar10 + 0x3e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ù',(ulong)uVar5,"i4le(p + 5)",now,"now",(void *)0x0);
  i2le(pcVar9 + uVar10 + 0x3b);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'þ',_v1 + 4,"q","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  uVar1 = i2le(_v1 + 5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ÿ',(ulong)uVar1,"i2le(q + 4)",0x14,"20",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x16));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ā',(ulong)uVar1,"i2le(q + 6)",0,"0",(void *)0x0);
  uVar1 = i2le(_v1 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ā',(ulong)uVar1,"i2le(q + 8)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x1a));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ă',(ulong)uVar1,"i2le(q + 10)",
                      (long)(ptVar7->tm_sec / 2 + ptVar7->tm_min * 0x20 + ptVar7->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  uVar1 = i2le(_v1 + 7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ă',(ulong)uVar1,"i2le(q + 12)",
                      (long)(ptVar7->tm_mon * 0x20 + ptVar7->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar7->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  uVar5 = i4le((void *)((long)_v1 + 0x1e));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ą',(ulong)uVar5,"i4le(q + 14)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)_v1 + 0x22));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ą',(ulong)uVar5,"i4le(q + 18)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)_v1 + 0x26));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ć',(ulong)uVar5,"i4le(q + 22)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x2a));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ć',(ulong)uVar1,"i2le(q + 26)",7,"strlen(folder_name)",(void *)0x0);
  piVar12 = _v1 + 0xb;
  uVar1 = i2le(piVar12);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ĉ',(ulong)uVar1,"i2le(q + 28)",0x29,"41",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ĉ',(void *)((long)_v1 + 0x2e),"q + 30","folder/","folder_name",7,
                      "strlen(folder_name)",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x35));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Č',(ulong)uVar1,"i2le(q)",0x7875,"0x7875",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x37));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'č',(ulong)uVar1,"i2le(q + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ď',(long)*(char *)((long)_v1 + 0x39),"q[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ď',(long)*(char *)((long)_v1 + 0x3a),"q[5]",4,"4",(void *)0x0);
  uVar5 = i4le((void *)((long)_v1 + 0x3b));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Đ',(ulong)uVar5,"i4le(q + 6)",0x1e,"folder_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'đ',(long)*(char *)((long)_v1 + 0x3f),"q[10]",4,"4",(void *)0x0);
  uVar5 = i4le(_v1 + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ē',(ulong)uVar5,"i4le(q + 11)",0x28,"folder_gid",(void *)0x0);
  uVar1 = i2le((void *)((long)_v1 + 0x37));
  uVar10 = (ulong)uVar1;
  p__00 = (void *)((long)_v1 + uVar10 + 0x39);
  uVar1 = i2le(p__00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ĕ',(ulong)uVar1,"i2le(q)",0x5455,"0x5455",(void *)0x0);
  pvVar13 = (void *)((long)_v1 + uVar10 + 0x3b);
  uVar1 = i2le(pvVar13);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ė',(ulong)uVar1,"i2le(q + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ė',(long)*(char *)((long)_v1 + uVar10 + 0x3d),"q[4]",5,"5",(void *)0x0);
  uVar5 = i4le((void *)((long)_v1 + uVar10 + 0x3e));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ę',(ulong)uVar5,"i4le(q + 5)",now,"now",(void *)0x0);
  uVar5 = i4le((void *)((long)_v1 + uVar10 + 0x42));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ę',(ulong)uVar5,"i4le(q + 9)",now + 5,"now + 5",(void *)0x0);
  uVar1 = i2le(pvVar13);
  uVar10 = (ulong)uVar1;
  pvVar13 = (void *)((long)p__00 + uVar10 + 4);
  uVar1 = i2le(pvVar13);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ĝ',(ulong)uVar1,"i2le(q)",0x6c78,"0x6c78",(void *)0x0);
  p__01 = (void *)((long)p__00 + uVar10 + 6);
  uVar1 = i2le(p__01);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ĝ',(ulong)uVar1,"i2le(q + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ğ',(long)*(char *)((long)p__00 + uVar10 + 8),"q[4]",7,"7",(void *)0x0);
  uVar1 = i2le((void *)((long)p__00 + uVar10 + 9));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ğ',(ulong)(uVar1 >> 8),"i2le(q + 5) >> 8",3,"3",(void *)0x0);
  uVar1 = i2le((void *)((long)p__00 + uVar10 + 0xb));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'Ġ',(ulong)uVar1,"i2le(q + 7)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)p__00 + uVar10 + 0xd));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ġ',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(q + 9) >> 16 & 01777",0x1ed,
                      "folder_perm",(void *)0x0);
  uVar1 = i2le(p__01);
  uVar2 = i2le(piVar12);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                   ,L'Ĥ',(uint)((long)pvVar13 + (ulong)uVar1 + 4 == (long)_v1 + (ulong)uVar2 + 0x35
                                ),"q == extra_start + i2le(local_header + 28)",(void *)0x0);
  uVar1 = i2le(piVar12);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_compression_lzmaxz.c"
                      ,L'ĩ',(void *)((long)_v1 + (ulong)uVar1 + 0x35),"q","PK\x01\x02",
                      "\"PK\\001\\002\"",4,"4",(void *)0x0);
  archive_read_free(a);
  return;
}

Assistant:

static void verify_xz_lzma(const char *buff, size_t used, uint16_t id,
	uint16_t flags)
{
	const char *buffend;
	struct archive* zip_archive;
	struct archive_entry *ae;
	char filedata[sizeof(file_data1) + sizeof(file_data2)];
	/* Misc variables */
	unsigned long crc;
	struct tm *tm;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif
	/* p is the pointer to walk over the central directory,
	 * q walks over the local headers, the data and the data descriptors. */
	const char *p, *q, *local_header, *extra_start;

#if defined(HAVE_LOCALTIME_S)
	tm = localtime_s(&tmbuf, &now) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	tm = localtime_r(&now, &tmbuf);
#else
	tm = localtime(&now);
#endif

	/* Open archive from memory, we'll need it for checking the file
	 * value */
	assert((zip_archive = archive_read_new()) != NULL);
	assertEqualIntA(zip_archive, ARCHIVE_OK, archive_read_support_format_all(zip_archive));
	assertEqualIntA(zip_archive, ARCHIVE_OK, archive_read_support_filter_all(zip_archive));
	assertEqualIntA(zip_archive, ARCHIVE_OK, archive_read_open_memory(zip_archive, buff, used));

	/* Remember the end of the archive in memory. */
	buffend = buff + used;

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2le(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2le(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2le(p + 8), i2le(p + 10));
	failure("CD start (%u) + CD length (%u) should == archive size - 22",
	    i4le(p + 12), i4le(p + 16));
	assertEqualInt(i4le(p + 12) + i4le(p + 16), used - 22);
	failure("no zip comment");
	assertEqualInt(i2le(p + 20), 0);

	/* Get address of first entry in central directory. */
	p = buff + i4le(buffend - 6);
	failure("Central file record at offset %u should begin with"
	    " PK\\001\\002 signature",
	    i4le(buffend - 10));

	/* Verify file entry in central directory, except compressed size (offset 20). */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2le(p + 4), 3 * 256 + 63); /* Version made by */
	assertEqualInt(i2le(p + 6), 63); /* Version needed to extract */
	assertEqualInt(i2le(p + 8), flags); /* Flags */
	assertEqualInt(i2le(p + 10), id); /* Compression method */
	assertEqualInt(i2le(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data1, sizeof(file_data1));
	crc = bitcrc32(crc, file_data2, sizeof(file_data2));
	assertEqualInt(i4le(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4le(p + 24), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	assertEqualInt(i2le(p + 28), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2le(p + 30), 24); /* Extra field length */
	assertEqualInt(i2le(p + 32), 0); /* File comment length */
	assertEqualInt(i2le(p + 34), 0); /* Disk number start */
	assertEqualInt(i2le(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4le(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4le(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = p + 46 + strlen(file_name);

	assertEqualInt(i2le(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
/* TODO */
	p = p + 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), now); /* 'UT' mtime */
	p = p + 4 + i2le(p + 2);

	/* Verify local header of file entry. */
	local_header = q = buff;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2le(q + 4), 63); /* Version needed to extract */
	assertEqualInt(i2le(q + 6), flags); /* Flags: bit 3 = length-at-end (required because CRC32 is unknown) and bit 1 = EOPM (because we always write it) */
	assertEqualInt(i2le(q + 8), id); /* Compression method */
	assertEqualInt(i2le(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4le(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4le(q + 18), 0); /* Compressed size, must be zero because of length-at-end */
	assertEqualInt(i4le(q + 22), 0); /* Uncompressed size, must be zero because of length-at-end */
	assertEqualInt(i2le(q + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2le(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, file_name, strlen(file_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(file_name);

	assertEqualInt(i2le(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2le(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(q + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(q + 11), file_gid); /* 'Ux' GID */
	q = q + 4 + i2le(q + 2);

	assertEqualInt(i2le(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2le(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 3); /* 'UT' flags */
	assertEqualInt(i4le(q + 5), now); /* 'UT' mtime */
	assertEqualInt(i4le(q + 9), now + 3); /* 'UT' atime */
	q = q + 4 + i2le(q + 2);

	assertEqualInt(i2le(q), 0x6c78); /* 'xl' experimental extension header */
	assertEqualInt(i2le(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* Bitmap of fields included. */
	assertEqualInt(i2le(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2le(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4le(q + 9) >> 16 & 01777, file_perm); /* external file attributes */
	q = q + 4 + i2le(q + 2);

	assert(q == extra_start + i2le(local_header + 28));
	q = extra_start + i2le(local_header + 28);

	/* Verify data of file entry, using our own zip reader to test. */
	assertEqualIntA(zip_archive, ARCHIVE_OK, archive_read_next_header(zip_archive, &ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualIntA(zip_archive, sizeof(filedata), archive_read_data(zip_archive, filedata, sizeof(filedata)));
	assertEqualMem(filedata, file_data1, sizeof(file_data1));
	assertEqualMem(filedata + sizeof(file_data1), file_data2,
		sizeof(file_data2));

	/* Skip data of file entry in q */
	while (q < buffend - 3) {
		if (memcmp(q, "PK\007\010", 4) == 0) {
			break;
		}
		q++;
	}

	/* Verify data descriptor of file entry, except compressed size (offset 8). */
	assertEqualMem(q, "PK\007\010", 4); /* Signature */
	assertEqualInt(i4le(q + 4), crc); /* CRC-32 */
	assertEqualInt(i4le(q + 12), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	q = q + 16;

	/* Verify folder entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2le(p + 4), 3 * 256 + 20); /* Version made by */
	assertEqualInt(i2le(p + 6), 20); /* Version needed to extract */
	assertEqualInt(i2le(p + 8), 0); /* Flags */
	assertEqualInt(i2le(p + 10), 0); /* Compression method */
	assertEqualInt(i2le(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = 0;
	assertEqualInt(i4le(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4le(p + 20), 0); /* Compressed size */
	assertEqualInt(i4le(p + 24), 0); /* Uncompressed size */
	assertEqualInt(i2le(p + 28), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2le(p + 30), 24); /* Extra field length */
	assertEqualInt(i2le(p + 32), 0); /* File comment length */
	assertEqualInt(i2le(p + 34), 0); /* Disk number start */
	assertEqualInt(i2le(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4le(p + 38) >> 16 & 01777, folder_perm); /* External file attrs */
	assertEqualInt(i4le(p + 42), q - buff); /* Offset of local header */
	assertEqualMem(p + 46, folder_name, strlen(folder_name)); /* Pathname */
	p = p + 46 + strlen(folder_name);

	assertEqualInt(i2le(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(p + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(p + 11), folder_gid); /* 'ux' GID */
	p = p + 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), now); /* 'UT' mtime */
	p = p + 4 + i2le(p + 2);

	/* Verify local header of folder entry. */
	local_header = q;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2le(q + 4), 20); /* Version needed to extract */
	assertEqualInt(i2le(q + 6), 0); /* Flags */
	assertEqualInt(i2le(q + 8), 0); /* Compression method */
	assertEqualInt(i2le(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2le(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4le(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4le(q + 18), 0); /* Compressed size */
	assertEqualInt(i4le(q + 22), 0); /* Uncompressed size */
	assertEqualInt(i2le(q + 26), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2le(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, folder_name, strlen(folder_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(folder_name);

	assertEqualInt(i2le(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2le(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(q + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(q + 11), folder_gid); /* 'ux' GID */
	q = q + 4 + i2le(q + 2);

	assertEqualInt(i2le(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2le(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 5); /* 'UT' flags */
	assertEqualInt(i4le(q + 5), now); /* 'UT' mtime */
	assertEqualInt(i4le(q + 9), now + 5); /* 'UT' atime */
	q = q + 4 + i2le(q + 2);

	assertEqualInt(i2le(q), 0x6c78); /* 'xl' experimental extension header */
	assertEqualInt(i2le(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* bitmap of fields */
	assertEqualInt(i2le(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2le(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4le(q + 9) >> 16 & 01777, folder_perm); /* external file attributes */
	q = q + 4 + i2le(q + 2);

	assert(q == extra_start + i2le(local_header + 28));
	q = extra_start + i2le(local_header + 28);

	/* There should not be any data in the folder entry,
	 * so the first central directory entry should be next: */
	assertEqualMem(q, "PK\001\002", 4); /* Signature */

	/* Close archive, in case. */
	archive_read_free(zip_archive);
}